

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::anon_unknown_1::PrimitiveSetInvarianceCase::init
          (PrimitiveSetInvarianceCase *this,EVP_PKEY_CTX *ctx)

{
  deInt32 *pdVar1;
  WindingUsage WVar2;
  Winding WVar3;
  Context *pCVar4;
  RenderContext *renderCtx;
  pointer pPVar5;
  SharedPtrStateBase *pSVar6;
  TestLog *log;
  ShaderProgram *pSVar7;
  PrimitiveSetInvarianceCase *pPVar8;
  byte bVar9;
  RenderTarget *pRVar10;
  long *plVar11;
  ulong uVar12;
  pointer pPVar13;
  pointer pPVar14;
  pointer pWVar15;
  pointer extraout_RAX;
  TestError *this_00;
  uint uVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  ContextInfo *pCVar18;
  size_type *psVar19;
  ulong *puVar20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar21;
  Context *code;
  uint uVar22;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  ulong extraout_RDX_04;
  ulong extraout_RDX_05;
  ulong uVar23;
  pointer pPVar24;
  long lVar25;
  size_type *psVar26;
  undefined1 in_R9B;
  pointer pPVar27;
  pointer pPVar28;
  int iVar29;
  pointer pWVar30;
  ulong uVar31;
  vector<deqp::gles31::Functional::(anonymous_namespace)::Winding,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Winding>_>
  windings;
  string fragmentShaderTemplate;
  ScopedLogSection section;
  string tessellationEvaluationTemplate;
  string tessellationControlTemplate;
  string floatLit01;
  string vertexShaderTemplate;
  undefined1 local_428 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_418;
  undefined1 local_400 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f0;
  size_type *local_3d8;
  value_type local_3d0;
  ShaderProgram *local_3b0;
  PrimitiveSetInvarianceCase *local_3a8;
  size_type *local_3a0;
  value_type local_398;
  uint local_374;
  ShaderProgram *local_370;
  SharedPtrStateBase *local_368;
  Winding local_360;
  ShaderProgram *local_358;
  SharedPtrStateBase *local_350;
  ulong local_348;
  long local_340;
  vector<deqp::gles31::Functional::(anonymous_namespace)::Winding,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Winding>_>
  local_338;
  undefined1 local_320 [36];
  float local_2fc;
  string local_2f8;
  ulong local_2d8;
  Context *local_2d0;
  long local_2c8;
  Context local_2c0;
  long local_2a8;
  undefined1 local_2a0 [16];
  ContextInfo *local_290;
  pointer local_288;
  undefined1 local_280 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260;
  _Base_ptr local_250 [2];
  TestContext *local_240 [2];
  undefined1 local_230 [32];
  string local_210;
  string local_1f0;
  string local_1d0;
  undefined1 local_1b0 [8];
  pointer local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0 [3];
  ios_base local_140 [8];
  ios_base local_138 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_120;
  deUint32 local_108;
  undefined1 local_100 [208];
  
  local_338.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Winding,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Winding>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_338.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Winding,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Winding>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_338.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Winding,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Winding>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  WVar2 = this->m_windingUsage;
  if (WVar2 == WINDINGUSAGE_VARY) {
    local_1b0 = (undefined1  [8])((ulong)(uint)local_1b0._4_4_ << 0x20);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::Winding,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Winding>_>
    ::push_back(&local_338,(value_type *)local_1b0);
    local_1b0._0_4_ = 1;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::Winding,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Winding>_>
    ::push_back(&local_338,(value_type *)local_1b0);
  }
  else if (WVar2 == WINDINGUSAGE_CW) {
    local_1b0._0_4_ = 1;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::Winding,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Winding>_>
    ::push_back(&local_338,(value_type *)local_1b0);
  }
  else if (WVar2 == WINDINGUSAGE_CCW) {
    local_1b0 = (undefined1  [8])((ulong)local_1b0 & 0xffffffff00000000);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::Winding,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Winding>_>
    ::push_back(&local_338,(value_type *)local_1b0);
  }
  checkTessellationSupport((this->super_TestCase).m_context);
  pRVar10 = Context::getRenderTarget((this->super_TestCase).m_context);
  checkRenderTargetSize
            ((Functional *)(ulong)(uint)pRVar10->m_width,
             (RenderTarget *)(ulong)(uint)pRVar10->m_height,0x10);
  local_348 = 0;
  pWVar15 = local_338.
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Winding,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Winding>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  uVar12 = extraout_RDX;
  pWVar30 = local_338.
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Winding,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Winding>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_3a8 = this;
  do {
    uVar16 = (uint)local_348;
    if ((int)((ulong)((long)pWVar15 - (long)pWVar30) >> 2) < 1) {
      uVar22 = uVar16 + 1;
    }
    else {
      local_2fc = 10.0 / (float)(int)(uVar16 | 10);
      local_374 = uVar16 + 1;
      local_340 = 0;
      do {
        psVar26 = &local_3d0._M_string_length;
        de::floatToString_abi_cxx11_((string *)(local_280 + 0x10),(de *)0x2,local_2fc,(int)uVar12);
        local_2d8 = (long)(this->m_programs).
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->m_programs).
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program>_>
                          ._M_impl.super__Vector_impl_data._M_start;
        local_250[0] = (_Base_ptr)local_240;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_250,
                   "${GLSL_VERSION_DECL}\n\nin highp float in_v_attr;\nout highp float in_tc_attr;\n\nvoid main (void)\n{\n\tin_tc_attr = in_v_attr;\n}\n"
                   ,"");
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
        std::ostream::operator<<((ostringstream *)local_1b0,local_374);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
        std::ios_base::~ios_base(local_140);
        plVar11 = (long *)std::__cxx11::string::replace((ulong)&local_3d8,0,(char *)0x0,0x1c45f37);
        local_428._0_8_ = &local_418;
        paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 == paVar17) {
          local_418._M_allocated_capacity = paVar17->_M_allocated_capacity;
          local_418._8_8_ = plVar11[3];
        }
        else {
          local_418._M_allocated_capacity = paVar17->_M_allocated_capacity;
          local_428._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar11;
        }
        local_428._8_8_ = plVar11[1];
        *plVar11 = (long)paVar17;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        plVar11 = (long *)std::__cxx11::string::append(local_428);
        local_2c0.m_contextInfo = (ContextInfo *)local_2a0;
        pCVar18 = (ContextInfo *)(plVar11 + 2);
        if ((ContextInfo *)*plVar11 == pCVar18) {
          local_2a0._0_8_ = pCVar18->_vptr_ContextInfo;
          local_2a0._8_8_ = plVar11[3];
        }
        else {
          local_2a0._0_8_ = pCVar18->_vptr_ContextInfo;
          local_2c0.m_contextInfo = (ContextInfo *)*plVar11;
        }
        local_2a8 = plVar11[1];
        *plVar11 = (long)pCVar18;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_428._0_8_ != &local_418) {
          operator_delete((void *)local_428._0_8_,local_418._M_allocated_capacity + 1);
        }
        if (local_3d8 != psVar26) {
          operator_delete(local_3d8,local_3d0._M_string_length + 1);
        }
        Functional::(anonymous_namespace)::getTessellationEvaluationInLayoutString_abi_cxx11_
                  ((string *)local_320,(_anonymous_namespace_ *)(ulong)this->m_primitiveType,
                   this->m_spacing,pWVar30[local_340],(uint)this->m_usePointMode,(bool)in_R9B);
        plVar11 = (long *)std::__cxx11::string::replace((ulong)local_320,0,(char *)0x0,0x1c4562f);
        psVar19 = (size_type *)(plVar11 + 2);
        if ((size_type *)*plVar11 == psVar19) {
          local_398._M_string_length = *psVar19;
          local_398.field_2._M_allocated_capacity = plVar11[3];
          local_3a0 = &local_398._M_string_length;
        }
        else {
          local_398._M_string_length = *psVar19;
          local_3a0 = (size_type *)*plVar11;
        }
        local_398._M_dataplus._M_p = (pointer)plVar11[1];
        *plVar11 = (long)psVar19;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        plVar11 = (long *)std::__cxx11::string::append((char *)&local_3a0);
        local_400._0_8_ = &local_3f0;
        paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 == paVar17) {
          local_3f0._M_allocated_capacity = paVar17->_M_allocated_capacity;
          local_3f0._8_8_ = plVar11[3];
        }
        else {
          local_3f0._M_allocated_capacity = paVar17->_M_allocated_capacity;
          local_400._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar11;
        }
        local_400._8_8_ = plVar11[1];
        *plVar11 = (long)paVar17;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        plVar11 = (long *)std::__cxx11::string::_M_append(local_400,local_280._16_8_);
        puVar20 = (ulong *)(plVar11 + 2);
        if ((size_type *)*plVar11 == puVar20) {
          local_3d0._M_string_length = *puVar20;
          local_3d0.field_2._M_allocated_capacity = plVar11[3];
          local_3d8 = psVar26;
        }
        else {
          local_3d0._M_string_length = *puVar20;
          local_3d8 = (size_type *)*plVar11;
        }
        local_3d0._M_dataplus._M_p = (pointer)plVar11[1];
        *plVar11 = (long)puVar20;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        plVar11 = (long *)std::__cxx11::string::append((char *)&local_3d8);
        local_428._0_8_ = &local_418;
        paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 == paVar17) {
          local_418._M_allocated_capacity = paVar17->_M_allocated_capacity;
          local_418._8_8_ = plVar11[3];
        }
        else {
          local_418._M_allocated_capacity = paVar17->_M_allocated_capacity;
          local_428._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar11;
        }
        local_428._8_8_ = plVar11[1];
        *plVar11 = (long)paVar17;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        plVar11 = (long *)std::__cxx11::string::_M_append(local_428,local_280._16_8_);
        pbVar21 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(plVar11 + 2)
        ;
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar11 == pbVar21
           ) {
          local_1a0[0]._M_dataplus._M_p = (pbVar21->_M_dataplus)._M_p;
          local_1a0[0]._M_string_length = plVar11[3];
          local_1b0 = (undefined1  [8])local_1a0;
        }
        else {
          local_1a0[0]._M_dataplus._M_p = (pbVar21->_M_dataplus)._M_p;
          local_1b0 = (undefined1  [8])*plVar11;
        }
        local_1a8 = (pointer)plVar11[1];
        *plVar11 = (long)pbVar21;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        plVar11 = (long *)std::__cxx11::string::append(local_1b0);
        local_2d0 = &local_2c0;
        code = (Context *)(plVar11 + 2);
        if ((Context *)*plVar11 == code) {
          local_2c0.m_testCtx = code->m_testCtx;
          local_2c0.m_renderCtx = (RenderContext *)plVar11[3];
        }
        else {
          local_2c0.m_testCtx = code->m_testCtx;
          local_2d0 = (Context *)*plVar11;
        }
        local_2c8 = plVar11[1];
        *plVar11 = (long)code;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        if (local_1b0 != (undefined1  [8])local_1a0) {
          operator_delete((void *)local_1b0,(ulong)(local_1a0[0]._M_dataplus._M_p + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_428._0_8_ != &local_418) {
          operator_delete((void *)local_428._0_8_,local_418._M_allocated_capacity + 1);
        }
        if (local_3d8 != psVar26) {
          operator_delete(local_3d8,local_3d0._M_string_length + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_400._0_8_ != &local_3f0) {
          operator_delete((void *)local_400._0_8_,local_3f0._M_allocated_capacity + 1);
        }
        if (local_3a0 != &local_398._M_string_length) {
          operator_delete(local_3a0,local_398._M_string_length + 1);
        }
        if ((Context *)local_320._0_8_ != (Context *)(local_320 + 0x10)) {
          operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
        }
        local_320._0_8_ = local_320 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_320,
                   "${GLSL_VERSION_DECL}\n\nlayout (location = 0) out mediump vec4 o_color;\n\nin highp vec4 in_f_color;\n\nvoid main (void)\n{\n\to_color = in_f_color;\n}\n"
                   ,"");
        WVar3 = pWVar30[local_340];
        local_3b0 = (ShaderProgram *)operator_new(0xd0);
        pCVar4 = (this->super_TestCase).m_context;
        renderCtx = pCVar4->m_renderCtx;
        memset(local_1b0,0,0xac);
        local_100._0_8_ = (pointer)0x0;
        local_100[8] = 0;
        local_100._9_7_ = 0;
        local_100[0x10] = 0;
        local_100._17_8_ = 0;
        Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
                  (&local_2f8,(_anonymous_namespace_ *)pCVar4->m_renderCtx,(Context *)local_250[0],
                   (char *)code);
        local_428._0_8_ = local_428._0_8_ & 0xffffffff00000000;
        local_428._8_8_ = local_418._M_local_buf + 8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(local_428 + 8),local_2f8._M_dataplus._M_p,
                   local_2f8._M_dataplus._M_p + local_2f8._M_string_length);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(local_1b0 + (local_428._0_8_ & 0xffffffff) * 0x18),
                    (value_type *)(local_428 + 8));
        pPVar8 = local_3a8;
        pSVar7 = local_3b0;
        Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
                  (&local_1d0,
                   (_anonymous_namespace_ *)((local_3a8->super_TestCase).m_context)->m_renderCtx,
                   (Context *)local_2c0.m_contextInfo,(char *)code);
        local_3d8 = (size_type *)CONCAT44(local_3d8._4_4_,3);
        local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3d0,local_1d0._M_dataplus._M_p,
                   local_1d0._M_dataplus._M_p + local_1d0._M_string_length);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(local_1b0 + ((ulong)local_3d8 & 0xffffffff) * 0x18),&local_3d0);
        Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
                  (&local_1f0,
                   (_anonymous_namespace_ *)((pPVar8->super_TestCase).m_context)->m_renderCtx,
                   local_2d0,(char *)code);
        local_400._0_4_ = 4;
        local_400._8_8_ = local_3f0._M_local_buf + 8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(local_400 + 8),local_1f0._M_dataplus._M_p,
                   local_1f0._M_dataplus._M_p + local_1f0._M_string_length);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(local_1b0 + (local_400._0_8_ & 0xffffffff) * 0x18),
                    (value_type *)(local_400 + 8));
        Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
                  (&local_210,
                   (_anonymous_namespace_ *)((pPVar8->super_TestCase).m_context)->m_renderCtx,
                   (Context *)local_320._0_8_,(char *)code);
        local_3a0 = (size_type *)CONCAT44(local_3a0._4_4_,1);
        local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_398,local_210._M_dataplus._M_p,
                   local_210._M_dataplus._M_p + local_210._M_string_length);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(local_1b0 + ((ulong)local_3a0 & 0xffffffff) * 0x18),&local_398);
        local_290 = (ContextInfo *)local_280;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"out_te_tessCoord","");
        local_230._0_8_ = local_230 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_230,local_290,
                   (undefined1 *)((long)&(local_288->_M_dataplus)._M_p + (long)local_290));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_100,(value_type *)local_230);
        local_108 = 0x8c8c;
        glu::ShaderProgram::ShaderProgram(pSVar7,renderCtx,(ProgramSources *)local_1b0);
        local_368 = (SharedPtrStateBase *)0x0;
        local_370 = pSVar7;
        local_368 = (SharedPtrStateBase *)operator_new(0x20);
        local_368->strongRefCount = 0;
        local_368->weakRefCount = 0;
        local_368->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_02137b98;
        local_368[1]._vptr_SharedPtrStateBase = (_func_int **)pSVar7;
        local_368->strongRefCount = 1;
        local_368->weakRefCount = 1;
        local_358 = pSVar7;
        LOCK();
        local_368->strongRefCount = local_368->strongRefCount + 1;
        UNLOCK();
        LOCK();
        local_368->weakRefCount = local_368->weakRefCount + 1;
        UNLOCK();
        pPVar27 = (pPVar8->m_programs).
                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        local_360 = WVar3;
        local_350 = local_368;
        if (pPVar27 ==
            (pPVar8->m_programs).
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          pPVar5 = (pPVar8->m_programs).
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((long)pPVar27 - (long)pPVar5 == 0x7ffffffffffffff8) {
            std::__throw_length_error("vector::_M_realloc_insert");
          }
          lVar25 = (long)pPVar27 - (long)pPVar5 >> 3;
          uVar23 = lVar25 * -0x5555555555555555;
          uVar12 = uVar23;
          if (pPVar27 == pPVar5) {
            uVar12 = 1;
          }
          uVar31 = uVar12 + uVar23;
          if (0x555555555555554 < uVar31) {
            uVar31 = 0x555555555555555;
          }
          if (CARRY8(uVar12,uVar23)) {
            uVar31 = 0x555555555555555;
          }
          if (uVar31 == 0) {
            pPVar13 = (pointer)0x0;
          }
          else {
            pPVar13 = (pointer)operator_new(uVar31 * 0x18);
          }
          (&pPVar13->winding)[lVar25 * 2] = local_360;
          (&(pPVar13->program).m_ptr)[lVar25] = local_358;
          (&(pPVar13->program).m_state)[lVar25] = local_350;
          if (local_350 != (SharedPtrStateBase *)0x0) {
            LOCK();
            local_350->strongRefCount = local_350->strongRefCount + 1;
            UNLOCK();
            LOCK();
            pdVar1 = &(&(pPVar13->program).m_state)[lVar25]->weakRefCount;
            *pdVar1 = *pdVar1 + 1;
            UNLOCK();
          }
          pPVar24 = pPVar13 + 1;
          pPVar14 = pPVar5;
          if (pPVar27 != pPVar5) {
            do {
              pPVar24[-1].winding = pPVar14->winding;
              pPVar24[-1].program.m_ptr = (pPVar14->program).m_ptr;
              pSVar6 = (pPVar14->program).m_state;
              pPVar24[-1].program.m_state = pSVar6;
              if (pSVar6 != (SharedPtrStateBase *)0x0) {
                LOCK();
                pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
                UNLOCK();
                LOCK();
                pdVar1 = &(pPVar24[-1].program.m_state)->weakRefCount;
                *pdVar1 = *pdVar1 + 1;
                UNLOCK();
              }
              pPVar14 = pPVar14 + 1;
              pPVar24 = pPVar24 + 1;
              pPVar28 = pPVar5;
            } while (pPVar14 != pPVar27);
            do {
              pSVar6 = (pPVar28->program).m_state;
              if (pSVar6 != (SharedPtrStateBase *)0x0) {
                LOCK();
                pdVar1 = &pSVar6->strongRefCount;
                *pdVar1 = *pdVar1 + -1;
                UNLOCK();
                if (*pdVar1 == 0) {
                  (pPVar28->program).m_ptr = (ShaderProgram *)0x0;
                  (*((pPVar28->program).m_state)->_vptr_SharedPtrStateBase[2])();
                }
                LOCK();
                pdVar1 = &((pPVar28->program).m_state)->weakRefCount;
                *pdVar1 = *pdVar1 + -1;
                UNLOCK();
                if (*pdVar1 == 0) {
                  pSVar6 = (pPVar28->program).m_state;
                  if (pSVar6 != (SharedPtrStateBase *)0x0) {
                    (*pSVar6->_vptr_SharedPtrStateBase[1])();
                  }
                  (pPVar28->program).m_state = (SharedPtrStateBase *)0x0;
                }
              }
              pPVar28 = pPVar28 + 1;
            } while (pPVar28 != pPVar27);
          }
          uVar12 = local_2d8;
          pPVar8 = local_3a8;
          if (pPVar5 != (pointer)0x0) {
            operator_delete(pPVar5,(long)(local_3a8->m_programs).
                                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                   (long)pPVar5);
          }
          (pPVar8->m_programs).
          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program>_>
          ._M_impl.super__Vector_impl_data._M_start = pPVar13;
          (pPVar8->m_programs).
          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program>_>
          ._M_impl.super__Vector_impl_data._M_finish = pPVar24;
          (pPVar8->m_programs).
          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = pPVar13 + uVar31;
        }
        else {
          pPVar27->winding = WVar3;
          (pPVar27->program).m_ptr = pSVar7;
          (pPVar27->program).m_state = local_368;
          if (local_368 != (SharedPtrStateBase *)0x0) {
            LOCK();
            local_368->strongRefCount = local_368->strongRefCount + 1;
            UNLOCK();
            LOCK();
            pdVar1 = &((pPVar27->program).m_state)->weakRefCount;
            *pdVar1 = *pdVar1 + 1;
            UNLOCK();
            pPVar27 = (pPVar8->m_programs).
                      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          }
          (pPVar8->m_programs).
          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program>_>
          ._M_impl.super__Vector_impl_data._M_finish = pPVar27 + 1;
          uVar12 = local_2d8;
        }
        pSVar6 = local_350;
        psVar26 = &local_3d0._M_string_length;
        if (local_350 != (SharedPtrStateBase *)0x0) {
          LOCK();
          pdVar1 = &local_350->strongRefCount;
          *pdVar1 = *pdVar1 + -1;
          UNLOCK();
          if (*pdVar1 == 0) {
            local_358 = (ShaderProgram *)0x0;
            (*local_350->_vptr_SharedPtrStateBase[2])(local_350);
          }
          LOCK();
          pdVar1 = &pSVar6->weakRefCount;
          *pdVar1 = *pdVar1 + -1;
          UNLOCK();
          if (*pdVar1 == 0) {
            if (local_350 != (SharedPtrStateBase *)0x0) {
              (*local_350->_vptr_SharedPtrStateBase[1])();
            }
            local_350 = (SharedPtrStateBase *)0x0;
          }
        }
        if (local_368 != (SharedPtrStateBase *)0x0) {
          LOCK();
          pdVar1 = &local_368->strongRefCount;
          *pdVar1 = *pdVar1 + -1;
          UNLOCK();
          if (*pdVar1 == 0) {
            local_370 = (ShaderProgram *)0x0;
            (*local_368->_vptr_SharedPtrStateBase[2])();
          }
          LOCK();
          pdVar1 = &local_368->weakRefCount;
          *pdVar1 = *pdVar1 + -1;
          UNLOCK();
          if (*pdVar1 == 0) {
            if (local_368 != (SharedPtrStateBase *)0x0) {
              (*local_368->_vptr_SharedPtrStateBase[1])();
            }
            local_368 = (SharedPtrStateBase *)0x0;
          }
        }
        if ((ContextInfo *)local_230._0_8_ != (ContextInfo *)(local_230 + 0x10)) {
          operator_delete((void *)local_230._0_8_,local_230._16_8_ + 1);
        }
        if (local_290 != (ContextInfo *)local_280) {
          operator_delete(local_290,(ulong)((long)&((_Alloc_hider *)local_280._0_8_)->_M_p + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_398._M_dataplus._M_p != &local_398.field_2) {
          operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != &local_210.field_2) {
          operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
        }
        if ((char *)local_400._8_8_ != local_3f0._M_local_buf + 8) {
          operator_delete((void *)local_400._8_8_,local_3f0._8_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
          operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
          operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
          operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
        }
        if ((char *)local_428._8_8_ != local_418._M_local_buf + 8) {
          operator_delete((void *)local_428._8_8_,local_418._8_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
          operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
        }
        iVar29 = (int)(uVar12 >> 3) * -0x55555555;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_100);
        std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::
        ~vector(&local_120);
        lVar25 = 0x78;
        do {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(local_1b0 + lVar25));
          this = local_3a8;
          lVar25 = lVar25 + -0x18;
        } while (lVar25 != -0x18);
        log = ((local_3a8->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
        std::ostream::operator<<((ostringstream *)local_1b0,iVar29);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
        std::ios_base::~ios_base(local_140);
        plVar11 = (long *)std::__cxx11::string::replace((ulong)&local_3d8,0,(char *)0x0,0x1c6170e);
        local_428._0_8_ = &local_418;
        paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 == paVar17) {
          local_418._M_allocated_capacity = paVar17->_M_allocated_capacity;
          local_418._8_8_ = plVar11[3];
        }
        else {
          local_418._M_allocated_capacity = paVar17->_M_allocated_capacity;
          local_428._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar11;
        }
        local_428._8_8_ = plVar11[1];
        *plVar11 = (long)paVar17;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
        std::ostream::operator<<((ostringstream *)local_1b0,iVar29);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
        std::ios_base::~ios_base(local_140);
        plVar11 = (long *)std::__cxx11::string::replace((ulong)&local_3a0,0,(char *)0x0,0x1aedaa0);
        local_400._0_8_ = &local_3f0;
        paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 == paVar17) {
          local_3f0._M_allocated_capacity = paVar17->_M_allocated_capacity;
          local_3f0._8_8_ = plVar11[3];
        }
        else {
          local_3f0._M_allocated_capacity = paVar17->_M_allocated_capacity;
          local_400._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar11;
        }
        local_400._8_8_ = plVar11[1];
        *plVar11 = (long)paVar17;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        tcu::ScopedLogSection::ScopedLogSection
                  ((ScopedLogSection *)&local_2f8,log,(string *)local_428,(string *)local_400);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_400._0_8_ != &local_3f0) {
          operator_delete((void *)local_400._0_8_,local_3f0._M_allocated_capacity + 1);
        }
        if (local_3a0 != &local_398._M_string_length) {
          operator_delete(local_3a0,local_398._M_string_length + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_428._0_8_ != &local_418) {
          operator_delete((void *)local_428._0_8_,local_418._M_allocated_capacity + 1);
        }
        if (local_3d8 != psVar26) {
          operator_delete(local_3d8,local_3d0._M_string_length + 1);
        }
        pSVar7 = (this->m_programs).
                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].program.m_ptr;
        if ((iVar29 == 0) || (bVar9 = (pSVar7->m_program).m_info.linkOk, (bool)bVar9 == false)) {
          glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                          pSVar7);
          bVar9 = (((this->m_programs).
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program>_>
                    ._M_impl.super__Vector_impl_data._M_finish[-1].program.m_ptr)->m_program).m_info
                  .linkOk;
        }
        if ((bVar9 & 1) == 0) {
          this_00 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_00,"Program compilation failed",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
                     ,0xe80);
          __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        if (0 < iVar29) {
          local_1b0 = (undefined1  [8])
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,"Note: program ",0xe);
          std::ostream::operator<<((ostringstream *)&local_1a8,iVar29);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,
                     " is similar to above, except some constants are different, and: ",0x40);
          local_3d0._M_dataplus._M_p = (pointer)0x0;
          local_3d0._M_string_length = local_3d0._M_string_length & 0xffffffffffffff00;
          local_3d8 = psVar26;
          plVar11 = (long *)std::__cxx11::string::append((char *)&local_3d8);
          local_428._0_8_ = &local_418;
          paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar11 == paVar17) {
            local_418._M_allocated_capacity = paVar17->_M_allocated_capacity;
            local_418._8_8_ = plVar11[3];
          }
          else {
            local_418._M_allocated_capacity = paVar17->_M_allocated_capacity;
            local_428._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*plVar11;
          }
          local_428._8_8_ = plVar11[1];
          *plVar11 = (long)paVar17;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          plVar11 = (long *)std::__cxx11::string::append(local_428);
          this = local_3a8;
          local_400._0_8_ = &local_3f0;
          paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar11 == paVar17) {
            local_3f0._M_allocated_capacity = paVar17->_M_allocated_capacity;
            local_3f0._8_8_ = plVar11[3];
          }
          else {
            local_3f0._M_allocated_capacity = paVar17->_M_allocated_capacity;
            local_400._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*plVar11;
          }
          local_400._8_8_ = plVar11[1];
          *plVar11 = (long)paVar17;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_428._0_8_ != &local_418) {
            operator_delete((void *)local_428._0_8_,local_418._M_allocated_capacity + 1);
          }
          if (local_3d8 != psVar26) {
            operator_delete(local_3d8,local_3d0._M_string_length + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,(char *)local_400._0_8_,local_400._8_8_);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_400._0_8_ != &local_3f0) {
            operator_delete((void *)local_400._0_8_,local_3f0._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
          std::ios_base::~ios_base(local_138);
        }
        tcu::TestLog::endSection((TestLog *)local_2f8._M_dataplus._M_p);
        uVar12 = extraout_RDX_00;
        if ((Context *)local_320._0_8_ != (Context *)(local_320 + 0x10)) {
          operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
          uVar12 = extraout_RDX_01;
        }
        if (local_2d0 != &local_2c0) {
          operator_delete(local_2d0,(ulong)((long)&(local_2c0.m_testCtx)->m_platform + 1));
          uVar12 = extraout_RDX_02;
        }
        if (local_2c0.m_contextInfo != (ContextInfo *)local_2a0) {
          operator_delete(local_2c0.m_contextInfo,(ulong)((long)(Platform **)local_2a0._0_8_ + 1));
          uVar12 = extraout_RDX_03;
        }
        if (local_250[0] != (_Base_ptr)local_240) {
          operator_delete(local_250[0],(ulong)((long)&local_240[0]->m_platform + 1));
          uVar12 = extraout_RDX_04;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._16_8_ != &local_260) {
          operator_delete((void *)local_280._16_8_,(ulong)(local_260._M_allocated_capacity + 1));
          uVar12 = extraout_RDX_05;
        }
        local_340 = local_340 + 1;
        pWVar30 = local_338.
                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Winding,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Winding>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      } while (local_340 <
               (int)((ulong)((long)local_338.
                                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Winding,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Winding>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_338.
                                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Winding,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Winding>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 2));
      uVar16 = (uint)local_348;
      pWVar15 = local_338.
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Winding,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Winding>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      uVar22 = local_374;
    }
    uVar12 = (ulong)uVar22;
    local_348 = uVar12;
    if (uVar16 != 0) {
      if (pWVar30 != (pointer)0x0) {
        operator_delete(pWVar30,(long)local_338.
                                      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Winding,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Winding>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)pWVar30);
        pWVar15 = extraout_RAX;
      }
      return (int)pWVar15;
    }
  } while( true );
}

Assistant:

void PrimitiveSetInvarianceCase::init (void)
{
	const int			numDifferentConstantExprCases = 2;
	vector<Winding>		windings;
	switch (m_windingUsage)
	{
		case WINDINGUSAGE_CCW:		windings.push_back(WINDING_CCW); break;
		case WINDINGUSAGE_CW:		windings.push_back(WINDING_CW); break;
		case WINDINGUSAGE_VARY:		windings.push_back(WINDING_CCW);
									windings.push_back(WINDING_CW); break;
		default: DE_ASSERT(false);
	}

	checkTessellationSupport(m_context);
	checkRenderTargetSize(m_context.getRenderTarget(), RENDER_SIZE);

	for (int constantExprCaseNdx = 0; constantExprCaseNdx < numDifferentConstantExprCases; constantExprCaseNdx++)
	{
		for (int windingCaseNdx = 0; windingCaseNdx < (int)windings.size(); windingCaseNdx++)
		{
			const string	floatLit01 = de::floatToString(10.0f / (float)(constantExprCaseNdx + 10), 2);
			const int		programNdx = (int)m_programs.size();

			std::string vertexShaderTemplate			("${GLSL_VERSION_DECL}\n"
															 "\n"
															 "in highp float in_v_attr;\n"
															 "out highp float in_tc_attr;\n"
															 "\n"
															 "void main (void)\n"
															 "{\n"
															 "	in_tc_attr = in_v_attr;\n"
														 "}\n");
			std::string tessellationControlTemplate		("${GLSL_VERSION_DECL}\n"
														 "${TESSELLATION_SHADER_REQUIRE}\n"
															 "\n"
															 "layout (vertices = " + de::toString(constantExprCaseNdx+1) + ") out;\n"
															 "\n"
															 "in highp float in_tc_attr[];\n"
															 "\n"
															 "patch out highp float in_te_positionOffset;\n"
															 "\n"
															 "void main (void)\n"
															 "{\n"
															 "	in_te_positionOffset = in_tc_attr[6];\n"
															 "\n"
															 "	gl_TessLevelInner[0] = in_tc_attr[0];\n"
															 "	gl_TessLevelInner[1] = in_tc_attr[1];\n"
															 "\n"
															 "	gl_TessLevelOuter[0] = in_tc_attr[2];\n"
															 "	gl_TessLevelOuter[1] = in_tc_attr[3];\n"
															 "	gl_TessLevelOuter[2] = in_tc_attr[4];\n"
															 "	gl_TessLevelOuter[3] = in_tc_attr[5];\n"
														 "}\n");
			std::string tessellationEvaluationTemplate	("${GLSL_VERSION_DECL}\n"
														 "${TESSELLATION_SHADER_REQUIRE}\n"
															 "\n"
															 + getTessellationEvaluationInLayoutString(m_primitiveType, m_spacing, windings[windingCaseNdx], m_usePointMode) +
															 "\n"
															 "patch in highp float in_te_positionOffset;\n"
															 "\n"
															 "out highp vec4 in_f_color;\n"
															 "invariant out highp vec3 out_te_tessCoord;\n"
															 "\n"
															 "void main (void)\n"
															 "{\n"
															 "	gl_Position = vec4(gl_TessCoord.xy*" + floatLit01 + " - in_te_positionOffset + float(gl_PrimitiveID)*0.1, 0.0, 1.0);\n"
															 "	in_f_color = vec4(" + floatLit01 + ");\n"
															 "	out_te_tessCoord = gl_TessCoord;\n"
														 "}\n");
			std::string fragmentShaderTemplate			("${GLSL_VERSION_DECL}\n"
															 "\n"
															 "layout (location = 0) out mediump vec4 o_color;\n"
															 "\n"
															 "in highp vec4 in_f_color;\n"
															 "\n"
															 "void main (void)\n"
															 "{\n"
															 "	o_color = in_f_color;\n"
														 "}\n");

			m_programs.push_back(Program(windings[windingCaseNdx],
										 SharedPtr<const ShaderProgram>(new ShaderProgram(m_context.getRenderContext(), glu::ProgramSources()
					<< glu::VertexSource					(specializeShader(m_context, vertexShaderTemplate.c_str()))
					<< glu::TessellationControlSource		(specializeShader(m_context, tessellationControlTemplate.c_str()))
					<< glu::TessellationEvaluationSource	(specializeShader(m_context, tessellationEvaluationTemplate.c_str()))
					<< glu::FragmentSource					(specializeShader(m_context, fragmentShaderTemplate.c_str()))
					<< glu::TransformFeedbackVarying		("out_te_tessCoord")
					<< glu::TransformFeedbackMode			(GL_INTERLEAVED_ATTRIBS)))));

			{
				const tcu::ScopedLogSection section(m_testCtx.getLog(), "Program" + de::toString(programNdx), "Program " + de::toString(programNdx));

				if (programNdx == 0 || !m_programs.back().program->isOk())
					m_testCtx.getLog() << *m_programs.back().program;

				if (!m_programs.back().program->isOk())
					TCU_FAIL("Program compilation failed");

				if (programNdx > 0)
					m_testCtx.getLog() << TestLog::Message << "Note: program " << programNdx << " is similar to above, except some constants are different, and: " << m_programs.back().description() << TestLog::EndMessage;
			}
		}
	}
}